

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revsurface.hpp
# Opt level: O1

vec3f __thiscall RevSurface::surface(RevSurface *this,float u,float v,vec3f *dpdu,vec3f *dpdv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3f vVar7;
  pair<vec3f,_vec3f> pnd;
  float local_58;
  float fStack_54;
  undefined1 local_30 [8];
  float local_28;
  undefined8 local_24;
  float local_1c;
  
  (**this->curve->_vptr_Curve)(SUB84((double)u,0),local_30);
  dpdu->z = local_1c;
  dpdu->x = (float)(undefined4)local_24;
  dpdu->y = (float)local_24._4_4_;
  fVar2 = cosf(PI * v * -2.0);
  fVar3 = sinf(v * -2.0 * PI);
  local_58 = local_30._0_4_;
  fStack_54 = local_30._4_4_;
  fVar6 = local_28 * -fVar3 + local_58 * fVar2 + fStack_54 * 0.0 + 0.0;
  vVar7.z = fVar3 * local_58 + fStack_54 * 0.0 + fVar2 * local_28 + 0.0;
  fVar4 = dpdu->x;
  fVar1 = dpdu->z;
  fVar5 = dpdu->y * 0.0;
  dpdu->x = fVar1 * -fVar3 + fVar4 * fVar2 + fVar5 + 0.0;
  dpdu->y = fVar1 * 0.0 + fVar4 * 0.0 + dpdu->y + 0.0;
  dpdu->z = fVar2 * fVar1 + fVar3 * fVar4 + fVar5 + 0.0;
  fVar4 = PI * -2.0;
  dpdv->x = 0.0 - vVar7.z * fVar4;
  dpdv->y = vVar7.z * 0.0 + fVar6 * -0.0;
  dpdv->z = fVar4 * fVar6;
  vVar7.y = local_28 * 0.0 + local_58 * 0.0 + fStack_54 + 0.0;
  vVar7.x = fVar6;
  return vVar7;
}

Assistant:

vec3f surface(float u, float v, vec3f& dpdu, vec3f& dpdv) const
	{
		vec3f p;
		auto pnd = curve->atParam(u);
		p = pnd.first;
		dpdu = pnd.second;
		// rotate around Y axis
	    float c = std::cos(-v*2*PI);
	    float s = std::sin(-v*2*PI);
		auto rot = mat4f(
	        c,  0, -s,  0,
	        0,  1,  0,  0,
	        s,  0,  c,  0,
	        0,  0,  0,  1
	    );
	    p = (rot * vec4f(p, 1)).xyz();
	    dpdu = (rot * vec4f(dpdu, 1)).xyz();
	    dpdv = cross(vec3f(p.x,0,p.z), vec3f(0,-2*PI,0));
	    return p;
	}